

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_23::Heap2LocalPass::doWalkFunction(Heap2LocalPass *this,Function *func)

{
  Expression **currp;
  bool *this_00;
  __node_base_ptr *pp_Var1;
  Id IVar2;
  Block *pBVar3;
  _Hash_node_base *p_Var4;
  LocalGraphFlower **ppLVar5;
  pointer ppSVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  Index index;
  PassOptions *pPVar9;
  HeapType left;
  mapped_type *pmVar10;
  __node_ptr __node;
  HeapType right;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  Expression **ppEVar11;
  Function *__c;
  code *pcVar12;
  char *pcVar13;
  ulong __bkt;
  Index i;
  uint uVar14;
  pointer ppSVar15;
  Type type;
  StructNew *allocation;
  Module *in_R8;
  Module *pMVar16;
  Index i_1;
  size_type *psVar17;
  optional<wasm::Type> type_00;
  Struct2Local local_a40;
  Function *local_918;
  Module *local_910;
  PassOptions *local_908;
  LazyLocalGraph local_900;
  Inner local_790;
  undefined1 local_610 [312];
  undefined1 auStack_4d8 [8];
  AllocationFinder finder;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> gets;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_370;
  undefined1 local_260 [8];
  EscapeAnalyzer analyzer;
  EscapeAnalyzer analyzer_1;
  long lStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  HeapType local_c8;
  char local_c0;
  Index local_bc;
  Block *local_b8;
  Block *local_b0 [2];
  pointer local_a0;
  pointer local_98;
  Expression **local_90;
  undefined1 auStack_88 [8];
  Field element;
  FieldList fields;
  HeapType arrayType;
  HeapType local_48;
  LocalSet *local_40;
  Module *local_38;
  
  local_910 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>_>
              ).
              super_PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
              .currModule;
  pPVar9 = &((this->
             super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>_>
             ).super_Pass.runner)->options;
  local_918 = func;
  local_908 = pPVar9;
  local_38 = local_910;
  LazyLocalGraph::LazyLocalGraph(&local_900,func,local_910,(optional<wasm::Expression::Id>)0x0);
  Parents::Parents((Parents *)&local_790,func->body);
  currp = &func->body;
  BranchUtils::BranchTargets::BranchTargets((BranchTargets *)local_610,*currp);
  auStack_4d8 = (undefined1  [8])0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep =
       (Expression **)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currFunction =
       (Function *)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule = (Module *)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._9_8_ = 0;
  Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
            ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)auStack_4d8,
             PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::scan,currp);
  do {
    if (((long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
               super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible
               .
               super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
               super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
              super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep == 0)
    {
      local_a0 = (pointer)CONCAT71(finder.arrayNews.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   finder.arrayNews.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_);
      local_40 = (LocalSet *)0x0;
      type.id = 0;
      __c = (Function *)
            finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
            super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed.
            _M_elems[9].currp;
      ppSVar15 = finder.structNews.
                 super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_90 = currp;
      do {
        ppSVar6 = finder.structNews.
                  super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppSVar15 == local_a0) {
          pp_Var1 = &analyzer.reachedInteractions._M_h._M_single_bucket;
          for (pMVar16 = finder.
                         super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                         super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                         currModule; pMVar16 != (Module *)ppSVar6;
              pMVar16 = (Module *)
                        &(pMVar16->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
            allocation = (StructNew *)
                         (pMVar16->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            bVar8 = Heap2Local::canHandleAsLocals
                              ((Heap2Local *)
                               (allocation->super_SpecificExpression<(wasm::Expression::Id)65>).
                               super_Expression.type.id,type);
            if (bVar8) {
              analyzer.reachedInteractions._M_h._M_single_bucket = (__node_base_ptr)&local_900;
              analyzer_1.localGraph = (LazyLocalGraph *)&local_790;
              analyzer_1.parents = (Parents *)local_610;
              analyzer_1.passOptions = (PassOptions *)local_38;
              analyzer_1.sets._M_h._M_buckets = (__buckets_ptr)0x1;
              analyzer_1.sets._M_h._M_bucket_count = 0;
              analyzer_1.sets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              analyzer_1.sets._M_h._M_element_count._0_4_ = 0x3f800000;
              analyzer_1.sets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
              analyzer_1.sets._M_h._M_rehash_policy._4_4_ = 0;
              analyzer_1.sets._M_h._M_rehash_policy._M_next_resize = 0;
              __c = (Function *)&analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize
              ;
              analyzer_1.reachedInteractions._M_h._M_buckets = (__buckets_ptr)0x1;
              analyzer_1.reachedInteractions._M_h._M_bucket_count = 0;
              analyzer_1.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              analyzer_1.reachedInteractions._M_h._M_element_count._0_4_ = 0x3f800000;
              analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
              analyzer_1.reachedInteractions._M_h._M_rehash_policy._4_4_ = 0;
              analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize = 0;
              type.id = (uintptr_t)allocation;
              analyzer_1.branchTargets = (BranchTargets *)pPVar9;
              analyzer_1.wasm = (Module *)&analyzer_1.sets._M_h._M_rehash_policy._M_next_resize;
              analyzer_1.sets._M_h._M_single_bucket = (__node_base_ptr)__c;
              bVar8 = EscapeAnalyzer::escapes((EscapeAnalyzer *)pp_Var1,(Expression *)allocation);
              if (!bVar8) {
                __c = func;
                Struct2Local::Struct2Local
                          ((Struct2Local *)&finder.hasPop,allocation,(EscapeAnalyzer *)pp_Var1,func,
                           local_38);
                Struct2Local::~Struct2Local((Struct2Local *)&finder.hasPop);
                local_40 = (LocalSet *)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                type.id = (uintptr_t)allocation;
              }
              EscapeAnalyzer::~EscapeAnalyzer((EscapeAnalyzer *)pp_Var1);
            }
          }
          if (((byte)finder.arrayNews.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage & (byte)local_40) != 0) {
            EHUtils::handleBlockNestedPops
                      ((EHUtils *)func,(Function *)local_38,(Module *)0x0,(FeaturePolicy)__c);
          }
          ::anon_func::AllocationFinder::~AllocationFinder((AllocationFinder *)auStack_4d8);
          BranchUtils::BranchTargets::Inner::~Inner((Inner *)local_610);
          Parents::Inner::~Inner(&local_790);
          LazyLocalGraph::~LazyLocalGraph(&local_900);
          return;
        }
        pBVar3 = (Block *)*ppSVar15;
        bVar8 = Heap2Local::canHandleAsLocals
                          ((Heap2Local *)
                           (pBVar3->super_SpecificExpression<(wasm::Expression::Id)1>).
                           super_Expression.type.id,type);
        if (bVar8) {
          local_260 = (undefined1  [8])&local_900;
          analyzer.localGraph = (LazyLocalGraph *)&local_790;
          analyzer.parents = (Parents *)local_610;
          analyzer.passOptions = (PassOptions *)local_38;
          __c = (Function *)&analyzer.sets._M_h._M_rehash_policy._M_next_resize;
          analyzer.sets._M_h._M_buckets = (__buckets_ptr)0x1;
          analyzer.sets._M_h._M_bucket_count = 0;
          analyzer.sets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          analyzer.sets._M_h._M_element_count._0_4_ = 0x3f800000;
          analyzer.sets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          analyzer.sets._M_h._M_rehash_policy._4_4_ = 0;
          analyzer.sets._M_h._M_rehash_policy._M_next_resize = 0;
          analyzer.sets._M_h._M_single_bucket =
               (__node_base_ptr)&analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize;
          analyzer.reachedInteractions._M_h._M_buckets = (__buckets_ptr)0x1;
          analyzer.reachedInteractions._M_h._M_bucket_count = 0;
          analyzer.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          analyzer.reachedInteractions._M_h._M_element_count._0_4_ = 0x3f800000;
          analyzer.reachedInteractions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          analyzer.reachedInteractions._M_h._M_rehash_policy._4_4_ = 0;
          analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize = 0;
          type.id = (uintptr_t)pBVar3;
          analyzer.branchTargets = (BranchTargets *)pPVar9;
          analyzer.wasm = (Module *)__c;
          bVar8 = EscapeAnalyzer::escapes((EscapeAnalyzer *)local_260,(Expression *)pBVar3);
          if (!bVar8) {
            analyzer.reachedInteractions._M_h._M_single_bucket = (__node_base_ptr)0x0;
            analyzer_1.localGraph = (LazyLocalGraph *)0x0;
            lStack_110 = 0;
            local_d8._M_allocated_capacity = (size_type)local_38;
            local_d8._8_8_ =
                 (pBVar3->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                 id;
            local_c8.id = 0x10;
            local_c0 = '\0';
            IVar2 = (pBVar3->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id
            ;
            if (IVar2 == ArrayNewFixedId) {
              local_bc = *(Index *)&(pBVar3->name).super_IString.str._M_str;
            }
            else {
              if (IVar2 != ArrayNewId) {
                handle_unreachable("bad allocation",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                                   ,0x4f1);
              }
              local_bc = Array2Struct::getIndex
                                   ((Array2Struct *)(pBVar3->name).super_IString.str._M_str,
                                    (Expression *)type.id);
            }
            left = wasm::Type::getHeapType
                             (&(pBVar3->super_SpecificExpression<(wasm::Expression::Id)1>).
                               super_Expression.type);
            local_98 = ppSVar15;
            HeapType::getArray((HeapType *)&finder.hasPop);
            auStack_88 = (undefined1  [8])finder._264_8_;
            element.type.id =
                 (uintptr_t)
                 gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            element.packedType = not_packed;
            element.mutable_ = Immutable;
            for (uVar14 = 0; uVar14 < local_bc; uVar14 = uVar14 + 1) {
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::push_back
                        ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&element.packedType,
                         (value_type *)auStack_88);
            }
            this_00 = &finder.hasPop;
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)this_00,
                       (vector<wasm::Field,_std::allocator<wasm::Field>_> *)&element.packedType);
            HeapType::HeapType(&local_48,(Struct *)this_00);
            local_c8.id = local_48.id;
            std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                      ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)this_00);
            IVar2 = (pBVar3->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id
            ;
            if (IVar2 == ArrayNewFixedId) {
              local_b8 = (Block *)Builder::makeStructNew<ArenaVector<wasm::Expression*>>
                                            ((Builder *)&local_d8._M_allocated_capacity,local_c8,
                                             (ArenaVector<wasm::Expression_*> *)&pBVar3->name);
              local_b0[0] = local_b8;
            }
            else {
              if (IVar2 != ArrayNewId) {
                handle_unreachable("bad allocation",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                                   ,0x435);
              }
              if ((pBVar3->name).super_IString.str._M_len == 0) {
                __c = (Function *)0x0;
                local_b8 = (Block *)Builder::makeStructNew
                                              ((Builder *)&local_d8._M_allocated_capacity,local_c8,
                                               (initializer_list<wasm::Expression_*>)ZEXT816(0));
                local_b0[0] = local_b8;
              }
              else {
                index = Builder::addVar(func,(Type)auStack_88);
                local_40 = Builder::makeLocalSet
                                     ((Builder *)&local_d8._M_allocated_capacity,index,
                                      (Expression *)(pBVar3->name).super_IString.str._M_len);
                finder.hasPop = false;
                finder._265_7_ = 0;
                gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                for (uVar14 = 0; auVar7 = auStack_88, uVar14 < local_bc; uVar14 = uVar14 + 1) {
                  local_48.id = (uintptr_t)
                                MixedArena::alloc<wasm::LocalGet>
                                          ((MixedArena *)(local_d8._M_allocated_capacity + 0x200));
                  *(Index *)&(((ExpressionList *)&((Block *)local_48.id)->name)->
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ).data = index;
                  (((SpecificExpression<(wasm::Expression::Id)8> *)
                   &((Block *)local_48.id)->super_SpecificExpression<(wasm::Expression::Id)1>)->
                  super_Expression).type.id = (uintptr_t)auVar7;
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  emplace_back<wasm::Expression*>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             &finder.hasPop,(Expression **)&local_48);
                }
                local_b8 = (Block *)Builder::
                                    makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                              ((Builder *)&local_d8._M_allocated_capacity,local_c8,
                                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                *)&finder.hasPop);
                in_R8 = (Module *)0x0;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)__c;
                local_b0[0] = Builder::makeSequence
                                        ((Builder *)&local_d8._M_allocated_capacity,
                                         (Expression *)local_40,(Expression *)local_b8,type_00);
                std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               *)&finder.hasPop);
              }
            }
            pmVar10 = std::
                      unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                      ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                                    *)&analyzer.sets._M_h._M_single_bucket,(key_type *)local_b0);
            pBVar3 = local_b8;
            *pmVar10 = Flows;
            local_48.id = (uintptr_t)local_b8;
            __bkt = (ulong)local_b8 % (ulong)analyzer.reachedInteractions._M_h._M_buckets;
            __node = std::
                     _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::_M_find_node((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)&analyzer.sets._M_h._M_single_bucket,__bkt,
                                    (key_type *)&local_48,(__hash_code)__c);
            if (__node == (__node_ptr)0x0) {
              finder._264_8_ = &analyzer.sets._M_h._M_single_bucket;
              __node = (__node_ptr)operator_new(0x18);
              (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
              *(Block **)
               &(__node->
                super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
                ).
                super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
                ._M_storage._M_storage = pBVar3;
              (__node->
              super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
              ).
              super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
              ._M_storage._M_storage.__data[8] = '\0';
              std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_insert_unique_node
                        ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&analyzer.sets._M_h._M_single_bucket,__bkt,(__hash_code)pBVar3,__node,
                         (size_type)in_R8);
              gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_Scoped_node::~_Scoped_node((_Scoped_node *)&finder.hasPop);
            }
            (__node->
            super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
            ).
            super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
            ._M_storage._M_storage.__data[8] = '\x02';
            psVar17 = &analyzer.reachedInteractions._M_h._M_bucket_count;
            pp_Var1 = &analyzer.reachedInteractions._M_h._M_single_bucket;
            while (psVar17 = (size_type *)*psVar17, psVar17 != (size_type *)0x0) {
              p_Var4 = ((__node_base *)(psVar17 + 1))->_M_nxt;
              if ((*(char *)&p_Var4->_M_nxt != '?') &&
                 (((ulong)p_Var4[1]._M_nxt & 1) == 0 && (_Hash_node_base *)0x6 < p_Var4[1]._M_nxt))
              {
                right = wasm::Type::getHeapType((Type *)(p_Var4 + 1));
                bVar8 = HeapType::isSubType(left,right);
                if (bVar8) {
                  if (left.id != right.id) {
                    local_c0 = '\x01';
                  }
                  p_Var4 = ((__node_base *)(psVar17 + 1))->_M_nxt[1]._M_nxt;
                  wasm::Type::Type((Type *)&finder.hasPop,local_c8,
                                   (uint)(((uint)p_Var4 & 3) == 2 && (_Hash_node_base *)0x6 < p_Var4
                                         ),Inexact);
                  ((__node_base *)(psVar17 + 1))->_M_nxt[1]._M_nxt =
                       (_Hash_node_base *)finder._264_8_;
                }
              }
            }
            if (analyzer_1.localGraph != (LazyLocalGraph *)0x0) {
              __assert_fail("stack.size() == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                            ,0x12d,
                            "void wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Array2Struct, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>]"
                           );
            }
            Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
            ::pushTask((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                        *)pp_Var1,
                       PostWalker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                       ::scan,local_90);
            while ((long)&((analyzer_1.localGraph)->super_LocalGraphBase).func + (lStack_110 >> 4)
                   != 0) {
              if (lStack_110 == 0) {
                if (analyzer_1.localGraph == (LazyLocalGraph *)0x0) {
                  pcVar13 = 
                  "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, N = 10]"
                  ;
                  goto LAB_00a1fcf8;
                }
                ppLVar5 = &analyzer_1.localGraph[-1].flower._M_t.
                           super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
                           .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl;
                analyzer_1.localGraph = (LazyLocalGraph *)((long)ppLVar5 + 7);
                pcVar12 = (code *)(&analyzer_1.reachedInteractions._M_h._M_element_count)
                                  [(long)ppLVar5 * 2];
                analyzer.reachedInteractions._M_h._M_single_bucket =
                     *(__node_base_ptr *)
                      (&analyzer_1.reachedInteractions._M_h._M_rehash_policy + (long)ppLVar5);
              }
              else {
                pcVar12 = *(code **)(lStack_110 + -0x10);
                analyzer.reachedInteractions._M_h._M_single_bucket =
                     *(__node_base_ptr *)(lStack_110 + -8);
                lStack_110 = lStack_110 + -0x10;
              }
              if ((analyzer.reachedInteractions._M_h._M_single_bucket)->_M_nxt ==
                  (_Hash_node_base *)0x0) {
                pcVar13 = 
                "void wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Array2Struct, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>]"
                ;
                goto LAB_00a1fcd9;
              }
              (*pcVar12)(pp_Var1);
            }
            if (local_c0 == '\x01') {
              ReFinalize::ReFinalize((ReFinalize *)&finder.hasPop);
              Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
              walkFunctionInModule(&local_370,func,local_38);
              ReFinalize::~ReFinalize((ReFinalize *)&finder.hasPop);
            }
            std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                      ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
                       &element.packedType);
            type.id = (uintptr_t)local_b8;
            Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
            ::~Walker((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                       *)pp_Var1);
            __c = func;
            in_R8 = local_38;
            Struct2Local::Struct2Local
                      (&local_a40,(StructNew *)type.id,(EscapeAnalyzer *)local_260,func,local_38);
            Struct2Local::~Struct2Local(&local_a40);
            local_40 = (LocalSet *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            ppSVar15 = local_98;
          }
          EscapeAnalyzer::~EscapeAnalyzer((EscapeAnalyzer *)local_260);
        }
        ppSVar15 = ppSVar15 + 1;
      } while( true );
    }
    if ((pointer)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                 super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed.
                 _M_elems[9].currp ==
        finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
        super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
          super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep ==
          (Expression **)0x0) {
        pcVar13 = 
        "T &wasm::SmallVector<wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, 10>::back() [T = wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, N = 10]"
        ;
LAB_00a1fcf8:
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,pcVar13);
      }
      ppEVar11 = finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                 super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed.
                 _M_elems[(long)finder.
                                super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                                .
                                super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                                .replacep + -2].currp;
      auStack_4d8 = (undefined1  [8])
                    finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                    fixed._M_elems
                    [(long)finder.
                           super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                           .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                           replacep + -1].func;
      finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep =
           (Expression **)
           ((long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep +
           -1);
    }
    else {
      ppEVar11 = (Expression **)
                 finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                 super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                 flexible.
                 super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_4d8 = (undefined1  [8])
                    finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                    flexible.
                    super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
           super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_4d8 == (Expression *)0x0) {
      pcVar13 = 
      "void wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::walk(Expression *&) [SubType = AllocationFinder, VisitorType = wasm::Visitor<AllocationFinder>]"
      ;
LAB_00a1fcd9:
      __assert_fail("*task.currp",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x132,pcVar13);
    }
    (*(code *)ppEVar11)((AllocationFinder *)auStack_4d8,(Expression **)auStack_4d8);
  } while( true );
}

Assistant:

void doWalkFunction(Function* func) {
    // Multiple rounds of optimization may work in theory, as once we turn one
    // allocation into locals, references written to its fields become
    // references written to locals, which we may see do not escape. However,
    // this does not work yet, since we do not remove the original allocation -
    // we just "detach" it from other things and then depend on other
    // optimizations to remove it. That means this pass must be interleaved with
    // vacuum, in particular, to optimize such nested allocations.
    // TODO Consider running multiple iterations here, and running vacuum in
    //      between them.
    Heap2Local(func, *getModule(), getPassOptions());
  }